

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

_Bool al_get_next_event(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT *ret_event)

{
  _func_void *p_Var1;
  ALLEGRO_SYSTEM *pAVar2;
  undefined8 *puVar3;
  long lVar4;
  _Bool _Var5;
  byte bVar6;
  
  bVar6 = 0;
  pAVar2 = al_get_system_driver();
  p_Var1 = pAVar2->vt->heartbeat;
  if (p_Var1 != (_func_void *)0x0) {
    (*p_Var1)();
  }
  if ((queue->mutex).inited == true) {
    pthread_mutex_lock((pthread_mutex_t *)&(queue->mutex).mutex);
  }
  if (queue->events_head == queue->events_tail) {
    _Var5 = false;
  }
  else {
    puVar3 = (undefined8 *)_al_vector_ref(&queue->events,queue->events_tail);
    _Var5 = false;
    queue->events_tail = (uint)((ulong)(queue->events_tail + 1) % (queue->events)._size);
    if (puVar3 != (undefined8 *)0x0) {
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        *(undefined8 *)ret_event = *puVar3;
        puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
        ret_event = (ALLEGRO_EVENT *)((long)ret_event + (ulong)bVar6 * -0x10 + 8);
      }
      _Var5 = true;
    }
  }
  if ((queue->mutex).inited == true) {
    pthread_mutex_unlock((pthread_mutex_t *)&(queue->mutex).mutex);
  }
  return _Var5;
}

Assistant:

bool al_get_next_event(ALLEGRO_EVENT_QUEUE *queue, ALLEGRO_EVENT *ret_event)
{
   ALLEGRO_EVENT *next_event;
   ASSERT(queue);
   ASSERT(ret_event);

   heartbeat();

   _al_mutex_lock(&queue->mutex);

   next_event = get_next_event_if_any(queue, true);
   if (next_event) {
      copy_event(ret_event, next_event);
      /* Don't increment reference count on user events. */
   }

   _al_mutex_unlock(&queue->mutex);

   return (next_event ? true : false);
}